

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::Pop(SQVM *this,SQInteger n)

{
  long lVar1;
  SQObjectPtr *in_RSI;
  SQVM *in_RDI;
  SQInteger i;
  long local_18;
  
  ValidateThreadAccess(in_RDI);
  for (local_18 = 0; local_18 < (long)in_RSI; local_18 = local_18 + 1) {
    lVar1 = in_RDI->_top + -1;
    in_RDI->_top = lVar1;
    sqvector<SQObjectPtr,_unsigned_int>::operator[](&in_RDI->_stack,(size_type)lVar1);
    ::SQObjectPtr::Null(in_RSI);
  }
  return;
}

Assistant:

void SQVM::Pop(SQInteger n) {
    ValidateThreadAccess();

    for(SQInteger i = 0; i < n; i++){
        _stack[--_top].Null();
    }
}